

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcollator.cpp
# Opt level: O2

QCollatorSortKey QCollator::defaultSortKey(QStringView key)

{
  Type *this;
  GenerationalCollator *this_00;
  QExplicitlySharedDataPointer<QCollatorSortKeyPrivate> in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  QStringView local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultCollator>_>::
         operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultCollator>_>
                     *)in_RDI.d.ptr);
  this_00 = QThreadStorage<(anonymous_namespace)::GenerationalCollator>::localData(this);
  anon_unknown.dwarf_b00545::GenerationalCollator::collator(this_00);
  QStringView::toString((QString *)&local_50,&local_38);
  sortKey((QCollator *)in_RDI.d.ptr,(QString *)this_00);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QExplicitlySharedDataPointer<QCollatorSortKeyPrivate>)
           (QExplicitlySharedDataPointer<QCollatorSortKeyPrivate>)in_RDI.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QCollatorSortKey QCollator::defaultSortKey(QStringView key)
{
    return defaultCollator->localData().collator().sortKey(key.toString());
}